

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

bool __thiscall QAccessibleTabButton::isValid(QAccessibleTabButton *this)

{
  QObject *this_00;
  bool bVar1;
  int iVar2;
  
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->m_parent);
  if ((bVar1) &&
     (this_00 = (this->m_parent).wp.value, (*(byte *)(*(long *)(this_00 + 8) + 0x1c2) & 4) == 0)) {
    iVar2 = QTabBar::count((QTabBar *)this_00);
    bVar1 = this->m_index < iVar2;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isValid() const override {
        if (m_parent) {
            if (static_cast<QWidget *>(m_parent.data())->d_func()->data.in_destructor)
                return false;
            return m_parent->count() > m_index;
        }
        return false;
    }